

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

shared_ptr<AssemblyCode::AssemblyCommand> createStore(CTemp *source,int offset,CTemp *beginSP)

{
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<AssemblyCode::AssemblyCommand> sVar1;
  undefined1 local_3c [4];
  undefined1 local_38 [24];
  CTemp *beginSP_local;
  undefined8 uStack_18;
  int offset_local;
  CTemp *source_local;
  
  uStack_18 = CONCAT44(in_register_00000034,offset);
  beginSP_local._4_4_ = (int)beginSP;
  local_3c = (undefined1  [4])-beginSP_local._4_4_;
  source_local = source;
  std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst,IRT::CTemp&,int,IRT::CTemp&>
            ((CTemp *)local_38,in_RCX,(CTemp *)local_3c);
  std::shared_ptr<AssemblyCode::AssemblyCommand>::
  shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst,void>
            ((shared_ptr<AssemblyCode::AssemblyCommand> *)source,
             (shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)local_38);
  std::shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst>::~shared_ptr
            ((shared_ptr<AssemblyCode::MoveRegToMemByRegPlusConst> *)local_38);
  sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)source;
  return (shared_ptr<AssemblyCode::AssemblyCommand>)
         sVar1.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssemblyCode::AssemblyCommand> createStore(IRT::CTemp& source, int offset, IRT::CTemp& beginSP) {
    return std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>(beginSP, -offset, source);
}